

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.hpp
# Opt level: O1

bool __thiscall diy::Master::Command<void>::skip(Command<void> *this,int i,Master *m)

{
  bool bVar1;
  int local_4;
  
  if ((this->s).super__Function_base._M_manager != (_Manager_type)0x0) {
    bVar1 = (*(this->s)._M_invoker)((_Any_data *)&this->s,&local_4,m);
    return bVar1;
  }
  std::__throw_bad_function_call();
}

Assistant:

bool  skip(int i, const Master& m) const override                             { return s(i,m); }